

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

CURLcode base64_encode(char *table64,Curl_easy *data,char *inputbuff,size_t insize,char **outptr,
                      size_t *outlen)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  char *__s;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  char *format;
  CURLcode CVar10;
  uchar ibuf [3];
  byte local_43 [3];
  undefined8 *local_40;
  char **local_38;
  
  *(undefined8 *)insize = 0;
  *outptr = (char *)0x0;
  if (inputbuff == (char *)0x0) {
    inputbuff = (char *)strlen((char *)data);
  }
  __s = (char *)(*Curl_cmalloc)((ulong)((long)inputbuff * 4) / 3 + 4);
  local_40 = (undefined8 *)insize;
  local_38 = outptr;
  pcVar6 = __s;
  if (__s == (char *)0x0) {
    CVar10 = CURLE_OUT_OF_MEMORY;
  }
  else {
    while (inputbuff != (char *)0x0) {
      lVar7 = 0;
      iVar5 = 0;
      do {
        if (inputbuff == (char *)0x0) {
          bVar8 = 0;
          inputbuff = (char *)0x0;
        }
        else {
          iVar5 = iVar5 + 1;
          bVar8 = *(byte *)&data->next;
          data = (Curl_easy *)((long)&data->next + 1);
          inputbuff = inputbuff + -1;
        }
        local_43[lVar7] = bVar8;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      bVar8 = local_43[0] >> 2;
      uVar9 = (uint)(local_43[1] >> 4) | (local_43[0] & 3) << 4;
      uVar1 = (uint)(local_43[2] >> 6) + (local_43[1] & 0xf) * 4;
      if (iVar5 == 2) {
        cVar2 = table64[bVar8];
        cVar3 = table64[uVar9];
        cVar4 = table64[uVar1];
        format = "%c%c%c=";
LAB_004fdd2a:
        curl_msnprintf(pcVar6,5,format,(ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3,
                       (ulong)(uint)(int)cVar4);
      }
      else {
        if (iVar5 != 1) {
          cVar2 = table64[bVar8];
          cVar3 = table64[uVar9];
          cVar4 = table64[uVar1];
          format = "%c%c%c%c";
          goto LAB_004fdd2a;
        }
        curl_msnprintf(pcVar6,5,"%c%c==",(ulong)(uint)(int)table64[bVar8],
                       (ulong)(uint)(int)table64[uVar9]);
      }
      pcVar6 = pcVar6 + 4;
    }
    *pcVar6 = '\0';
    *local_40 = __s;
    CVar10 = CURLE_OK;
    (*Curl_cfree)((void *)0x0);
    pcVar6 = (char *)strlen(__s);
    *local_38 = pcVar6;
  }
  return CVar10;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              struct Curl_easy *data,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  CURLcode result;
  unsigned char ibuf[3];
  unsigned char obuf[4];
  int i;
  int inputparts;
  char *output;
  char *base64data;
  char *convbuf = NULL;

  const char *indata = inputbuff;

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(indata);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc(insize * 4 / 3 + 4);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  /*
   * The base64 data needs to be created using the network encoding
   * not the host encoding.  And we can't change the actual input
   * so we copy it to a buffer, translate it, and use that instead.
   */
  result = Curl_convert_clone(data, indata, insize, &convbuf);
  if(result) {
    free(output);
    return result;
  }

  if(convbuf)
    indata = (char *)convbuf;

  while(insize > 0) {
    for(i = inputparts = 0; i < 3; i++) {
      if(insize > 0) {
        inputparts++;
        ibuf[i] = (unsigned char) *indata;
        indata++;
        insize--;
      }
      else
        ibuf[i] = 0;
    }

    obuf[0] = (unsigned char)  ((ibuf[0] & 0xFC) >> 2);
    obuf[1] = (unsigned char) (((ibuf[0] & 0x03) << 4) | \
                               ((ibuf[1] & 0xF0) >> 4));
    obuf[2] = (unsigned char) (((ibuf[1] & 0x0F) << 2) | \
                               ((ibuf[2] & 0xC0) >> 6));
    obuf[3] = (unsigned char)   (ibuf[2] & 0x3F);

    switch(inputparts) {
    case 1: /* only one byte read */
      snprintf(output, 5, "%c%c==",
               table64[obuf[0]],
               table64[obuf[1]]);
      break;

    case 2: /* two bytes read */
      snprintf(output, 5, "%c%c%c=",
               table64[obuf[0]],
               table64[obuf[1]],
               table64[obuf[2]]);
      break;

    default:
      snprintf(output, 5, "%c%c%c%c",
               table64[obuf[0]],
               table64[obuf[1]],
               table64[obuf[2]],
               table64[obuf[3]]);
      break;
    }
    output += 4;
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  free(convbuf);

  /* Return the length of the new data */
  *outlen = strlen(base64data);

  return CURLE_OK;
}